

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O3

void __thiscall NaDynAr<NaPetriConnector_*>::print_contents(NaDynAr<NaPetriConnector_*> *this)

{
  ulong uVar1;
  item *p;
  item *piVar2;
  
  NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n",this,(ulong)(uint)this->nItems);
  piVar2 = this->pHead;
  if (piVar2 != (item *)0x0) {
    uVar1 = 0;
    do {
      NaPrintLog("  [%d]\t",uVar1);
      NaPrintLog("next=0x%08p; data=0x%08p\n",piVar2->pNext,piVar2->pData);
      piVar2 = piVar2->pNext;
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (piVar2 != (item *)0x0);
  }
  return;
}

Assistant:

virtual void  print_contents () const {
    int	i = 0;
    NaPrintLog("DynAr(this=0x%08p), %d items, contents:\n", this, nItems);
    if(NULL != pHead){
      item	*p = pHead;

      do{
	NaPrintLog("  [%d]\t", i++);
	p->print_self();
	p = p->pNext;
      }while(NULL != p);
    }
  }